

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe.c
# Opt level: O0

kp_error_t kp_safe_save(kp_ctx *ctx,kp_safe *safe)

{
  kp_error_t kVar1;
  ulong uVar2;
  int *piVar3;
  void *in_RSI;
  kp_ctx *in_RDI;
  long in_FS_OFFSET;
  kp_error_t ret_1;
  kp_error_t ret;
  kp_unsafe unsafe;
  undefined4 in_stack_ffffffffffffcfd0;
  undefined4 in_stack_ffffffffffffcfd4;
  kp_agent_msg_type type;
  undefined4 in_stack_ffffffffffffcfe8;
  undefined4 in_stack_ffffffffffffcfec;
  undefined8 local_3010 [2];
  size_t in_stack_ffffffffffffd000;
  void *in_stack_ffffffffffffd008;
  undefined4 in_stack_ffffffffffffd010;
  kp_agent_msg_type in_stack_ffffffffffffd014;
  kp_ctx *in_stack_ffffffffffffd018;
  undefined1 auStack_2008 [4096];
  undefined1 auStack_1008 [4096];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI->password == '\0') {
    kVar1 = kp_password_prompt(in_RDI,false,in_RDI->password,"master");
    if (kVar1 != 0) goto LAB_00104c4b;
    in_stack_ffffffffffffcfd4 = 0;
  }
  if (((in_RDI->agent).connected & 1U) != 0) {
    memset(local_3010,0,0x3008);
    local_3010[0] = 0xffffffffffffffff;
    type = (kp_agent_msg_type)((ulong)in_RDI >> 0x20);
    kVar1 = kp_agent_send((kp_agent *)CONCAT44(in_stack_ffffffffffffcfec,in_stack_ffffffffffffcfe8),
                          type,in_RSI,CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0))
    ;
    if (kVar1 == 0) {
      kVar1 = kp_agent_receive((kp_agent *)in_stack_ffffffffffffd018,in_stack_ffffffffffffd014,
                               in_stack_ffffffffffffd008,in_stack_ffffffffffffd000);
      if (kVar1 == 0) {
        uVar2 = strlcpy(auStack_2008,*(undefined8 *)((long)in_RSI + 0x1008),0x1000);
        if (uVar2 < 0x1000) {
          uVar2 = strlcpy(auStack_1008,*(undefined8 *)((long)in_RSI + 0x1010),0x1000);
          if (uVar2 < 0x1000) {
            kp_agent_send((kp_agent *)CONCAT44(in_stack_ffffffffffffcfec,in_stack_ffffffffffffcfe8),
                          type,in_RSI,CONCAT44(in_stack_ffffffffffffcfd4,kVar1));
          }
          else {
            piVar3 = __errno_location();
            *piVar3 = 0xc;
          }
        }
        else {
          piVar3 = __errno_location();
          *piVar3 = 0xc;
        }
      }
      else if (kVar1 == 5) {
        __errno_location();
      }
    }
  }
  kVar1 = kp_storage_save(in_stack_ffffffffffffd018,
                          (kp_safe *)CONCAT44(in_stack_ffffffffffffd014,in_stack_ffffffffffffd010));
LAB_00104c4b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return kVar1;
}

Assistant:

kp_error_t
kp_safe_save(struct kp_ctx *ctx, struct kp_safe *safe)
{
	assert(ctx);
	assert(safe);
	assert(safe->open);

	if (ctx->password[0] == '\0') {
		kp_error_t ret;
		if ((ret = kp_password_prompt(ctx, false,
		                              (char *)ctx->password,
		                              "master")) != KP_SUCCESS) {
			return ret;
		}
	}

	if (ctx->agent.connected) {
		kp_error_t ret;
		struct kp_unsafe unsafe = KP_UNSAFE_INIT;

		if ((ret = kp_agent_send(&ctx->agent, KP_MSG_SEARCH, safe->name,
		    PATH_MAX)) != KP_SUCCESS) {
			/* TODO log reason in verbose mode */
			goto finally;
		}

		if ((ret = kp_agent_receive(&ctx->agent, KP_MSG_SEARCH, &unsafe,
		    sizeof(struct kp_unsafe))) != KP_SUCCESS) {
			if (ret != KP_ERRNO || errno != ENOENT) {
				/* TODO log reason in verbose mode */
			}
			goto finally;
		}

		if (strlcpy(unsafe.password, safe->password,
			    KP_PASSWORD_MAX_LEN) >= KP_PASSWORD_MAX_LEN) {
			errno = ENOMEM;
			goto finally;
		}
		if (strlcpy(unsafe.metadata, safe->metadata,
			    KP_METADATA_MAX_LEN) >= KP_METADATA_MAX_LEN) {
			errno = ENOMEM;
			goto finally;
		}

		if ((ret = kp_agent_send(&ctx->agent, KP_MSG_STORE, &unsafe,
		   sizeof(struct kp_unsafe))) != KP_SUCCESS) {
			/* TODO log reason in verbose mode */
			goto finally;
		}

	}

finally:
	return kp_storage_save(ctx, safe);
}